

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffm_score.cc
# Opt level: O2

void __thiscall
xLearn::FFMScore::calc_grad_ftrl(FFMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  float *pfVar1;
  float *pfVar2;
  real_t *prVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  uint uVar7;
  real_t *prVar8;
  undefined8 uVar9;
  float fVar10;
  bool bVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  pointer pNVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  pointer pNVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  pointer pNVar26;
  pointer pNVar27;
  long lVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar32;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar40 [64];
  real_t rVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar46 [16];
  
  auVar40._4_60_ = in_register_00001244;
  auVar40._0_4_ = norm;
  if (norm < 0.0) {
    fVar32 = sqrtf(norm);
  }
  else {
    auVar36 = vsqrtss_avx(auVar40._0_16_,auVar40._0_16_);
    fVar32 = auVar36._0_4_;
  }
  uVar6 = model->num_feat_;
  uVar7 = model->num_field_;
  prVar8 = model->param_w_;
  for (pNVar27 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                 super__Vector_impl_data._M_start; auVar36 = in_ZMM6._0_16_,
      pNVar27 !=
      (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
      super__Vector_impl_data._M_finish; pNVar27 = pNVar27 + 1) {
    uVar18 = pNVar27->feat_id;
    if (uVar18 < uVar6) {
      uVar12 = uVar18 * 3;
      uVar19 = uVar18 * 3 + 1;
      fVar30 = prVar8[uVar19];
      auVar35 = vfmadd231ss_fma(ZEXT416((uint)(pg * pNVar27->feat_val * fVar32)),
                                ZEXT416((uint)(this->super_Score).lambda_2_),
                                ZEXT416((uint)prVar8[uVar12]));
      auVar36 = vfmadd213ss_fma(auVar35,auVar35,ZEXT416((uint)fVar30));
      fVar29 = auVar36._0_4_;
      prVar8[uVar19] = fVar29;
      if (fVar29 < 0.0) {
        fVar29 = sqrtf(fVar29);
      }
      else {
        auVar36 = vsqrtss_avx(auVar36,auVar36);
        fVar29 = auVar36._0_4_;
      }
      if (fVar30 < 0.0) {
        fVar30 = sqrtf(fVar30);
      }
      else {
        auVar36 = vsqrtss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30));
        fVar30 = auVar36._0_4_;
      }
      auVar36._0_4_ = (fVar29 - fVar30) / (this->super_Score).alpha_;
      auVar36._4_12_ = SUB6012((undefined1  [60])0x0,0);
      uVar18 = uVar18 * 3 + 2;
      auVar36 = vfnmadd231ss_fma(ZEXT416(auVar35._0_4_),auVar36,ZEXT416((uint)prVar8[uVar12]));
      fVar29 = auVar36._0_4_ + prVar8[uVar18];
      auVar34 = ZEXT816(0);
      uVar9 = vcmpss_avx512f(auVar34,ZEXT416((uint)fVar29),1);
      bVar11 = (bool)((byte)uVar9 & 1);
      prVar8[uVar18] = fVar29;
      fVar30 = (this->super_Score).lambda_1_;
      fVar10 = (float)((uint)bVar11 * 0x3f800000 + (uint)!bVar11 * -0x40800000);
      if (fVar30 < fVar29 * fVar10) {
        fVar31 = prVar8[uVar19];
        fVar4 = (this->super_Score).beta_;
        if (fVar31 < 0.0) {
          fVar31 = sqrtf(fVar31);
        }
        else {
          auVar36 = vsqrtss_avx(ZEXT416((uint)fVar31),ZEXT416((uint)fVar31));
          fVar31 = auVar36._0_4_;
        }
        auVar36 = vfmsub213ss_fma(ZEXT416((uint)fVar30),ZEXT416((uint)fVar10),ZEXT416((uint)fVar29))
        ;
        auVar34._0_4_ =
             auVar36._0_4_ /
             ((fVar4 + fVar31) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_);
        auVar34._4_12_ = auVar36._4_12_;
      }
      prVar8[uVar12] = auVar34._0_4_;
    }
  }
  prVar8 = model->param_b_;
  fVar32 = prVar8[1];
  auVar35 = vfmadd213ss_fma(ZEXT416((uint)pg),ZEXT416((uint)pg),ZEXT416((uint)fVar32));
  fVar30 = auVar35._0_4_;
  prVar8[1] = fVar30;
  if (fVar30 < 0.0) {
    fVar30 = sqrtf(fVar30);
  }
  else {
    auVar35 = vsqrtss_avx(auVar35,auVar35);
    fVar30 = auVar35._0_4_;
  }
  if (fVar32 < 0.0) {
    fVar32 = sqrtf(fVar32);
  }
  else {
    auVar35 = vsqrtss_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar32));
    fVar32 = auVar35._0_4_;
  }
  auVar35._0_4_ = (fVar30 - fVar32) / (this->super_Score).alpha_;
  auVar35._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar35 = vfnmadd132ss_fma(auVar35,ZEXT416((uint)pg),ZEXT416((uint)*prVar8));
  fVar30 = auVar35._0_4_ + prVar8[2];
  uVar9 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)fVar30),1);
  bVar11 = (bool)((byte)uVar9 & 1);
  prVar8[2] = fVar30;
  fVar32 = (this->super_Score).lambda_1_;
  fVar29 = (float)((uint)bVar11 * 0x3f800000 + (uint)!bVar11 * -0x40800000);
  rVar41 = 0.0;
  if (fVar32 < fVar30 * fVar29) {
    auVar35 = vfmsub213ss_fma(ZEXT416((uint)fVar32),ZEXT416((uint)fVar29),ZEXT416((uint)fVar30));
    fVar32 = prVar8[1];
    fVar30 = (this->super_Score).beta_;
    if (fVar32 < 0.0) {
      fVar32 = sqrtf(fVar32);
    }
    else {
      auVar42 = vsqrtss_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar32));
      fVar32 = auVar42._0_4_;
    }
    rVar41 = auVar35._0_4_ /
             ((fVar30 + fVar32) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_);
  }
  *prVar8 = rVar41;
  auVar36 = vcvtusi2ss_avx512f(auVar36,model->num_K_);
  rVar41 = (this->super_Score).alpha_;
  auVar42._4_4_ = rVar41;
  auVar42._0_4_ = rVar41;
  auVar42._8_4_ = rVar41;
  auVar42._12_4_ = rVar41;
  fVar32 = (this->super_Score).lambda_2_;
  auVar36 = ZEXT416((uint)(auVar36._0_4_ * 0.25));
  auVar36 = vroundss_avx(auVar36,auVar36,10);
  iVar17 = vcvttss2usi_avx512f(auVar36);
  uVar18 = iVar17 * 0xc;
  iVar17 = model->num_field_ * uVar18;
  prVar8 = model->param_v_;
  pNVar20 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (pNVar27 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                 super__Vector_impl_data._M_start; pNVar27 != pNVar20; pNVar27 = pNVar27 + 1) {
    if (pNVar27->field_id < uVar7 && pNVar27->feat_id < uVar6) {
      uVar22 = (ulong)(pNVar27->feat_id * iVar17);
      uVar24 = (ulong)(pNVar27->field_id * uVar18);
      fVar30 = pNVar27->feat_val;
      pNVar16 = pNVar27;
      while (pNVar26 = pNVar16, pNVar16 = pNVar26 + 1, pNVar16 != pNVar20) {
        if (pNVar26[1].field_id < uVar7 && pNVar26[1].feat_id < uVar6) {
          uVar25 = (ulong)(pNVar26[1].feat_id * iVar17);
          uVar23 = (ulong)(pNVar26[1].field_id * uVar18);
          fVar29 = fVar30 * pNVar26[1].feat_val * norm * pg;
          for (uVar19 = 0; uVar19 < uVar18; uVar19 = uVar19 + 0xc) {
            uVar21 = (ulong)uVar19;
            pfVar1 = prVar8 + uVar22 + uVar23 + uVar21;
            fVar5 = *pfVar1;
            fVar13 = pfVar1[1];
            fVar14 = pfVar1[2];
            fVar15 = pfVar1[3];
            auVar36 = *(undefined1 (*) [16])(prVar8 + uVar24 + uVar25 + uVar21);
            auVar35 = *(undefined1 (*) [16])(prVar8 + uVar22 + uVar23 + uVar21 + 4);
            auVar38 = *(undefined1 (*) [16])(prVar8 + uVar24 + uVar25 + uVar21 + 4);
            fVar10 = auVar36._0_4_;
            fVar31 = auVar36._4_4_;
            fVar4 = auVar36._8_4_;
            fVar33 = auVar36._12_4_;
            auVar43._0_4_ = fVar32 * fVar5 + fVar29 * fVar10;
            auVar43._4_4_ = fVar32 * fVar13 + fVar29 * fVar31;
            auVar43._8_4_ = fVar32 * fVar14 + fVar29 * fVar4;
            auVar43._12_4_ = fVar32 * fVar15 + fVar29 * fVar33;
            auVar44._0_4_ = fVar29 * fVar5 + fVar32 * fVar10;
            auVar44._4_4_ = fVar29 * fVar13 + fVar32 * fVar31;
            auVar44._8_4_ = fVar29 * fVar14 + fVar32 * fVar4;
            auVar44._12_4_ = fVar29 * fVar15 + fVar32 * fVar33;
            auVar45._0_4_ = auVar35._0_4_ + auVar43._0_4_ * auVar43._0_4_;
            auVar45._4_4_ = auVar35._4_4_ + auVar43._4_4_ * auVar43._4_4_;
            auVar45._8_4_ = auVar35._8_4_ + auVar43._8_4_ * auVar43._8_4_;
            auVar45._12_4_ = auVar35._12_4_ + auVar43._12_4_ * auVar43._12_4_;
            auVar36 = vsqrtps_avx(auVar35);
            auVar35 = vsqrtps_avx(auVar45);
            auVar36 = vsubps_avx(auVar35,auVar36);
            auVar46._0_4_ = auVar38._0_4_ + auVar44._0_4_ * auVar44._0_4_;
            auVar46._4_4_ = auVar38._4_4_ + auVar44._4_4_ * auVar44._4_4_;
            auVar46._8_4_ = auVar38._8_4_ + auVar44._8_4_ * auVar44._8_4_;
            auVar46._12_4_ = auVar38._12_4_ + auVar44._12_4_ * auVar44._12_4_;
            auVar35 = vsqrtps_avx(auVar38);
            auVar36 = vdivps_avx(auVar36,auVar42);
            auVar38 = vsqrtps_avx(auVar46);
            auVar37._0_4_ = fVar5 * auVar36._0_4_;
            auVar37._4_4_ = fVar13 * auVar36._4_4_;
            auVar37._8_4_ = fVar14 * auVar36._8_4_;
            auVar37._12_4_ = fVar15 * auVar36._12_4_;
            auVar37 = vsubps_avx(auVar43,auVar37);
            pfVar1 = prVar8 + uVar22 + uVar23 + uVar21 + 8;
            fVar5 = pfVar1[1];
            fVar13 = pfVar1[2];
            fVar14 = pfVar1[3];
            auVar36 = vsubps_avx(auVar38,auVar35);
            auVar36 = vdivps_avx(auVar36,auVar42);
            auVar38._0_4_ = fVar10 * auVar36._0_4_;
            auVar38._4_4_ = fVar31 * auVar36._4_4_;
            auVar38._8_4_ = fVar4 * auVar36._8_4_;
            auVar38._12_4_ = fVar33 * auVar36._12_4_;
            auVar36 = vsubps_avx(auVar44,auVar38);
            pfVar2 = prVar8 + uVar24 + uVar25 + uVar21 + 8;
            auVar39._0_4_ = auVar36._0_4_ + *pfVar2;
            auVar39._4_4_ = auVar36._4_4_ + pfVar2[1];
            auVar39._8_4_ = auVar36._8_4_ + pfVar2[2];
            auVar39._12_4_ = auVar36._12_4_ + pfVar2[3];
            prVar3 = prVar8 + uVar22 + uVar23 + uVar21 + 8;
            *prVar3 = auVar37._0_4_ + *pfVar1;
            prVar3[1] = auVar37._4_4_ + fVar5;
            prVar3[2] = auVar37._8_4_ + fVar13;
            prVar3[3] = auVar37._12_4_ + fVar14;
            *(undefined1 (*) [16])(prVar8 + uVar24 + uVar25 + uVar21 + 8) = auVar39;
            *(undefined1 (*) [16])(prVar8 + uVar22 + uVar23 + uVar21 + 4) = auVar45;
            *(undefined1 (*) [16])(prVar8 + uVar24 + uVar25 + uVar21 + 4) = auVar46;
            for (lVar28 = -4; lVar28 != 0; lVar28 = lVar28 + 1) {
              fVar10 = prVar8[uVar22 + uVar23 + uVar21 + lVar28 + 0xc];
              auVar40 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar31 = (this->super_Score).lambda_1_;
              uVar9 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)fVar10),1);
              bVar11 = (bool)((byte)uVar9 & 1);
              fVar4 = (float)((uint)bVar11 * 0x3f800000 + (uint)!bVar11 * -0x40800000);
              rVar41 = 0.0;
              if (fVar31 < fVar10 * fVar4) {
                fVar33 = prVar8[uVar22 + uVar23 + uVar21 + lVar28 + 8];
                fVar5 = (this->super_Score).beta_;
                if (fVar33 < 0.0) {
                  fVar33 = sqrtf(fVar33);
                  auVar40 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar36 = vsqrtss_avx(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33));
                  fVar33 = auVar36._0_4_;
                }
                auVar36 = vfmsub213ss_fma(ZEXT416((uint)fVar31),ZEXT416((uint)fVar4),
                                          ZEXT416((uint)fVar10));
                rVar41 = auVar36._0_4_ /
                         ((fVar5 + fVar33) / (this->super_Score).alpha_ +
                         (this->super_Score).lambda_2_);
              }
              prVar8[uVar22 + uVar23 + uVar21 + lVar28 + 4] = rVar41;
              fVar10 = prVar8[uVar24 + uVar25 + uVar21 + lVar28 + 0xc];
              fVar31 = (this->super_Score).lambda_1_;
              uVar9 = vcmpss_avx512f(auVar40._0_16_,ZEXT416((uint)fVar10),1);
              bVar11 = (bool)((byte)uVar9 & 1);
              fVar4 = (float)((uint)bVar11 * 0x3f800000 + (uint)!bVar11 * -0x40800000);
              if (fVar31 < fVar10 * fVar4) {
                fVar33 = prVar8[uVar24 + uVar25 + uVar21 + lVar28 + 8];
                fVar5 = (this->super_Score).beta_;
                if (fVar33 < 0.0) {
                  fVar33 = sqrtf(fVar33);
                }
                else {
                  auVar36 = vsqrtss_avx(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33));
                  fVar33 = auVar36._0_4_;
                }
                auVar36 = vfmsub213ss_fma(ZEXT416((uint)fVar31),ZEXT416((uint)fVar4),
                                          ZEXT416((uint)fVar10));
                auVar40 = ZEXT1664(CONCAT124(auVar36._4_12_,
                                             auVar36._0_4_ /
                                             ((fVar5 + fVar33) / (this->super_Score).alpha_ +
                                             (this->super_Score).lambda_2_)));
              }
              prVar8[uVar24 + uVar25 + uVar21 + lVar28 + 4] = auVar40._0_4_;
            }
          }
          pNVar20 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        }
      }
    }
  }
  return;
}

Assistant:

void FFMScore::calc_grad_ftrl(const SparseRow* row,
                              Model& model,
                              real_t pg,
                              real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/  
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  index_t num_field = model.GetNumField();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id*3];
    real_t &wlg = w[feat_id*3+1];
    real_t &wlz = w[feat_id*3+2];
    real_t g = lambda_2_*wl+pg*iter->feat_val*sqrt_norm; 
    real_t old_wlg = wlg;
    wlg += g*g;
    real_t sigma = (sqrt(wlg)-sqrt(old_wlg)) / alpha_;
    wlz += (g-sigma*wl);
    int sign = wlz > 0 ? 1:-1;
    if (sign*wlz <= lambda_1_) {
      wl = 0;
    } else {
      wl = (sign*lambda_1_-wlz) / 
           ((beta_ + sqrt(wlg)) / 
            alpha_ + lambda_2_);
    }
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t &wbg = w[1];
  real_t &wbz = w[2];
  real_t g = pg;
  real_t old_wbg = wbg;
  wbg += g*g;
  real_t sigma = (sqrt(wbg)-sqrt(old_wbg)) / alpha_;
  wbz += (g-sigma*wb);
  int sign = wbz > 0 ? 1:-1;
  if (sign*wbz <= lambda_1_) {
    wb = 0;
  } else {
    wb = (sign*lambda_1_-wbz) / 
         ((beta_ + sqrt(wbg)) / 
          alpha_ + lambda_2_);
  }
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t align0 = 3 * model.get_aligned_k();
  index_t align1 = model.GetNumField() * align0;
  index_t align = kAlign * 3;
  w = model.GetParameter_v();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMalpha = _mm_set1_ps(alpha_);
  __m128 XMML2 = _mm_set1_ps(lambda_2_);
  for (SparseRow::const_iterator iter_i = row->begin();
       iter_i != row->end(); ++iter_i) {
    index_t j1 = iter_i->feat_id;
    index_t f1 = iter_i->field_id;
    // To avoid unseen feature
    if (j1 >= num_feat || f1 >= num_field) continue;
    real_t v1 = iter_i->feat_val;
    for (SparseRow::const_iterator iter_j = iter_i+1;
         iter_j != row->end(); ++iter_j) {
      index_t j2 = iter_j->feat_id;
      index_t f2 = iter_j->field_id;
      // To avoid unseen feature
      if (j2 >= num_feat || f2 >= num_field) continue;
      real_t v2 = iter_j->feat_val;
      real_t* w1_base = w + j1*align1 + f2*align0;
      real_t* w2_base = w + j2*align1 + f1*align0;
      __m128 XMMv = _mm_set1_ps(v1*v2*norm);
      __m128 XMMpgv = _mm_mul_ps(XMMv, XMMpg);
      for (index_t d = 0; d < align0; d += align) {
        real_t *w1 = w1_base + d;
        real_t *w2 = w2_base + d;
        real_t *wg1 = w1 + kAlign;
        real_t *wg2 = w2 + kAlign;
        real_t *z1 = w1 + kAlign * 2;
        real_t *z2 = w2 + kAlign * 2;
        __m128 XMMw1 = _mm_load_ps(w1);
        __m128 XMMw2 = _mm_load_ps(w2);
        __m128 XMMwg1 = _mm_load_ps(wg1);
        __m128 XMMwg2 = _mm_load_ps(wg2);
        __m128 XMMz1 = _mm_load_ps(z1);
        __m128 XMMz2 = _mm_load_ps(z2);
        __m128 XMMg1 = _mm_add_ps(
                       _mm_mul_ps(XMML2, XMMw1),
                       _mm_mul_ps(XMMpgv, XMMw2));
        __m128 XMMg2 = _mm_add_ps(
                       _mm_mul_ps(XMML2, XMMw2),
                       _mm_mul_ps(XMMpgv, XMMw1));
        __m128 XMMsigma1 = _mm_div_ps(
                           _mm_sub_ps(
                           _mm_sqrt_ps(
                           _mm_add_ps(XMMwg1,
                           _mm_mul_ps(XMMg1, XMMg1))),
                           _mm_sqrt_ps(XMMwg1)), XMMalpha);
        __m128 XMMsigma2 = _mm_div_ps(
                           _mm_sub_ps(
                           _mm_sqrt_ps(
                           _mm_add_ps(XMMwg2,
                           _mm_mul_ps(XMMg2, XMMg2))),
                           _mm_sqrt_ps(XMMwg2)), XMMalpha);
        XMMz1 = _mm_add_ps(XMMz1,
                _mm_sub_ps(XMMg1,
                _mm_mul_ps(XMMsigma1, XMMw1)));
        XMMz2 = _mm_add_ps(XMMz2,
                _mm_sub_ps(XMMg2,
                _mm_mul_ps(XMMsigma2, XMMw2)));
        _mm_store_ps(z1, XMMz1);
        _mm_store_ps(z2, XMMz2);
        XMMwg1 = _mm_add_ps(XMMwg1,
                 _mm_mul_ps(XMMg1, XMMg1));
        XMMwg2 = _mm_add_ps(XMMwg2,
                 _mm_mul_ps(XMMg2, XMMg2));
        _mm_store_ps(wg1, XMMwg1);
        _mm_store_ps(wg2, XMMwg2);
        // Update w. SSE may not faster
        for (size_t i = 0; i < kAlign; ++i) {
          // w1
          real_t z1_value = *(z1+i);
          int sign = z1_value > 0 ? 1 : -1;
          if (sign * z1_value <= lambda_1_) {
            *(w1+i) = 0;
          } else {
            *(w1+i) = (sign*lambda_1_-z1_value) / 
              ((beta_ + sqrt(*(wg1+i))) / alpha_ + lambda_2_);
          }
          // w2
          real_t z2_value = *(z2+i);
          sign = z2_value > 0 ? 1 : -1;
          if (sign * z2_value <= lambda_1_) {
            *(w2+i) = 0;
          } else {
            *(w2+i) = (sign*lambda_1_-z2_value) / 
              ((beta_ + sqrt(*(wg2+i))) / alpha_ + lambda_2_);
          }
        }
      }
    }
  }
}